

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void exprSetHeight(Expr *p)

{
  int iVar1;
  uint uVar2;
  Select *p_00;
  u32 uVar3;
  int nHeight;
  int local_1c;
  
  local_1c = 0;
  if ((p->pLeft != (Expr *)0x0) && (iVar1 = p->pLeft->nHeight, 0 < iVar1)) {
    local_1c = iVar1;
  }
  if ((p->pRight != (Expr *)0x0) && (iVar1 = p->pRight->nHeight, local_1c < iVar1)) {
    local_1c = iVar1;
  }
  uVar2 = p->flags;
  p_00 = (Select *)(p->x).pList;
  if ((uVar2 >> 0xb & 1) == 0) {
    if (p_00 != (Select *)0x0) {
      heightOfExprList((ExprList *)p_00,&local_1c);
      uVar3 = sqlite3ExprListFlags((ExprList *)p_00);
      p->flags = uVar3 & 0x200100 | uVar2;
    }
  }
  else {
    heightOfSelect(p_00,&local_1c);
  }
  p->nHeight = local_1c + 1;
  return;
}

Assistant:

static void exprSetHeight(Expr *p){
  int nHeight = 0;
  heightOfExpr(p->pLeft, &nHeight);
  heightOfExpr(p->pRight, &nHeight);
  if( ExprHasProperty(p, EP_xIsSelect) ){
    heightOfSelect(p->x.pSelect, &nHeight);
  }else if( p->x.pList ){
    heightOfExprList(p->x.pList, &nHeight);
    p->flags |= EP_Propagate & sqlite3ExprListFlags(p->x.pList);
  }
  p->nHeight = nHeight + 1;
}